

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void google::protobuf::TestUtil::AddRepeatedFields2<edition_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  TestAllTypes *pTVar1;
  TestAllTypes_RepeatedGroup *this;
  TestAllTypes_NestedMessage *pTVar2;
  ForeignMessage *this_00;
  ImportMessage *this_01;
  Reflection *pRVar3;
  Descriptor *pDVar4;
  FieldDescriptor *pFVar5;
  allocator<char> local_89;
  string local_88;
  string_view local_68 [2];
  allocator<char> local_41;
  string local_40;
  string_view local_20;
  TestAllTypes *local_10;
  TestAllTypes *message_local;
  
  local_10 = message;
  edition_unittest::TestAllTypes::add_repeated_int32(message,0x12d);
  edition_unittest::TestAllTypes::add_repeated_int64(local_10,0x12e);
  edition_unittest::TestAllTypes::add_repeated_uint32(local_10,0x12f);
  edition_unittest::TestAllTypes::add_repeated_uint64(local_10,0x130);
  edition_unittest::TestAllTypes::add_repeated_sint32(local_10,0x131);
  edition_unittest::TestAllTypes::add_repeated_sint64(local_10,0x132);
  edition_unittest::TestAllTypes::add_repeated_fixed32(local_10,0x133);
  edition_unittest::TestAllTypes::add_repeated_fixed64(local_10,0x134);
  edition_unittest::TestAllTypes::add_repeated_sfixed32(local_10,0x135);
  edition_unittest::TestAllTypes::add_repeated_sfixed64(local_10,0x136);
  edition_unittest::TestAllTypes::add_repeated_float(local_10,311.0);
  edition_unittest::TestAllTypes::add_repeated_double(local_10,312.0);
  edition_unittest::TestAllTypes::add_repeated_bool(local_10,false);
  edition_unittest::TestAllTypes::add_repeated_string<char_const(&)[4]>
            (local_10,(char (*) [4])"315");
  edition_unittest::TestAllTypes::add_repeated_bytes<char_const(&)[4]>(local_10,(char (*) [4])"316")
  ;
  this = edition_unittest::TestAllTypes::add_repeatedgroup(local_10);
  edition_unittest::TestAllTypes_RepeatedGroup::set_a(this,0x13d);
  pTVar2 = edition_unittest::TestAllTypes::add_repeated_nested_message(local_10);
  edition_unittest::TestAllTypes_NestedMessage::set_bb(pTVar2,0x13e);
  this_00 = edition_unittest::TestAllTypes::add_repeated_foreign_message(local_10);
  edition_unittest::ForeignMessage::set_c(this_00,0x13f);
  this_01 = edition_unittest::TestAllTypes::add_repeated_import_message(local_10);
  proto2_unittest_import::ImportMessage::set_d(this_01,0x140);
  pTVar2 = edition_unittest::TestAllTypes::add_repeated_lazy_message(local_10);
  edition_unittest::TestAllTypes_NestedMessage::set_bb(pTVar2,0x147);
  edition_unittest::TestAllTypes::add_repeated_nested_enum(local_10,TestAllTypes_NestedEnum_BAZ);
  edition_unittest::TestAllTypes::add_repeated_foreign_enum(local_10,FOREIGN_BAZ);
  edition_unittest::TestAllTypes::add_repeated_import_enum(local_10,IMPORT_BAZ);
  pRVar3 = edition_unittest::TestAllTypes::GetReflection();
  pTVar1 = local_10;
  pDVar4 = edition_unittest::TestAllTypes::GetDescriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"repeated_string_piece");
  pFVar5 = Descriptor::FindFieldByName(pDVar4,local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"324",&local_41);
  Reflection::AddString(pRVar3,&pTVar1->super_Message,pFVar5,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pRVar3 = edition_unittest::TestAllTypes::GetReflection();
  pTVar1 = local_10;
  pDVar4 = edition_unittest::TestAllTypes::GetDescriptor();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_68,"repeated_cord")
  ;
  pFVar5 = Descriptor::FindFieldByName(pDVar4,local_68[0]);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"325",&local_89);
  Reflection::AddString(pRVar3,&pTVar1->super_Message,pFVar5,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  return;
}

Assistant:

void AddRepeatedFields2(TestAllTypes* message) {
  // Add a second one of each field.
  message->add_repeated_int32(301);
  message->add_repeated_int64(302);
  message->add_repeated_uint32(303);
  message->add_repeated_uint64(304);
  message->add_repeated_sint32(305);
  message->add_repeated_sint64(306);
  message->add_repeated_fixed32(307);
  message->add_repeated_fixed64(308);
  message->add_repeated_sfixed32(309);
  message->add_repeated_sfixed64(310);
  message->add_repeated_float(311);
  message->add_repeated_double(312);
  message->add_repeated_bool(false);
  message->add_repeated_string("315");
  message->add_repeated_bytes("316");

  message->add_repeatedgroup()->set_a(317);
  message->add_repeated_nested_message()->set_bb(318);
  message->add_repeated_foreign_message()->set_c(319);
  message->add_repeated_import_message()->set_d(320);
  message->add_repeated_lazy_message()->set_bb(327);

  message->add_repeated_nested_enum(TestAllTypes::BAZ);
  message->add_repeated_foreign_enum(ForeignEnum<TestAllTypes>::FOREIGN_BAZ);
  message->add_repeated_import_enum(ImportEnum<TestAllTypes>::IMPORT_BAZ);

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->AddString(
      message,
      message->GetDescriptor()->FindFieldByName("repeated_string_piece"),
      "324");
  message->GetReflection()->AddString(
      message, message->GetDescriptor()->FindFieldByName("repeated_cord"),
      "325");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
}